

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampRangeClampCase::init
          (TextureBorderClampRangeClampCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  *this_00;
  TextureChannelClass TVar1;
  deUint32 dVar2;
  pointer pIVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  long lVar10;
  Vector<float,_4> *pVVar11;
  tcu *this_01;
  float s;
  GenericVec4 GVar12;
  IVec4 numBits;
  Vector<float,_4> local_148;
  TextureFormat texFormat;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  IVec4 value;
  IVec4 minValue;
  IterationConfig iteration;
  IVec4 maxValue;
  IVec4 valueRange;
  
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  texFormat = tcu::getEffectiveDepthStencilTextureFormat
                        ((TextureFormat *)
                         &((this->super_TextureBorderClampTest).m_texture.
                           super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                           m_data.ptr)->m_refTexture,
                         (this->super_TextureBorderClampTest).m_sampleMode);
  bVar4 = isDepthFormat((this->super_TextureBorderClampTest).m_texFormat,
                        (this->super_TextureBorderClampTest).m_sampleMode);
  TVar1 = (this->super_TextureBorderClampTest).m_channelClass;
  if (TVar1 == TEXTURECHANNELCLASS_FLOATING_POINT || bVar4) {
    TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
    iteration.p0.m_data[0] = -1.2;
    iteration.p0.m_data[1] = -3.0;
    iteration.p1.m_data[0] = 1.2;
    iteration.p1.m_data[1] = 2.5;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numBits,INFINITY);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numBits,0.5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numBits,0.25);
    std::__cxx11::string::assign((char *)&iteration.description);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,&iteration);
    std::__cxx11::string::~string((string *)&iteration.description);
    TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
    iteration.p0.m_data[0] = -0.25;
    iteration.p0.m_data[1] = -0.75;
    iteration.p1.m_data[0] = 2.25;
    iteration.p1.m_data[1] = 1.25;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numBits,-INFINITY);
    iteration.borderColor.v._0_8_ = CONCAT44(numBits.m_data[1],numBits.m_data[0]);
    iteration.borderColor.v._8_8_ = CONCAT44(numBits.m_data[3],numBits.m_data[2]);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numBits,0.5);
    iteration.lookupScale.m_data[1] = (float)numBits.m_data[1];
    iteration.lookupScale.m_data[0] = (float)numBits.m_data[0];
    iteration.lookupScale.m_data[3] = (float)numBits.m_data[3];
    iteration.lookupScale.m_data[2] = (float)numBits.m_data[2];
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numBits,0.25);
    iteration.lookupBias.m_data[1] = (float)numBits.m_data[1];
    iteration.lookupBias.m_data[0] = (float)numBits.m_data[0];
    iteration.lookupBias.m_data[3] = (float)numBits.m_data[3];
    iteration.lookupBias.m_data[2] = (float)numBits.m_data[2];
    std::__cxx11::string::assign((char *)&iteration.description);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,&iteration);
  }
  else if ((TVar1 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) == TEXTURECHANNELCLASS_SIGNED_INTEGER
          ) {
    tcu::getTextureFormatBitDepth((tcu *)&numBits,&texFormat);
    iVar5 = -1;
    minValue.m_data[3] = -1 << ((char)numBits.m_data[3] - 1U & 0x1f);
    if (0x1f < numBits.m_data[3]) {
      minValue.m_data[3] = -0x80000000;
    }
    iVar6 = 0;
    if (numBits.m_data[3] == 0) {
      minValue.m_data[3] = iVar6;
    }
    minValue.m_data[2] = -1 << ((char)numBits.m_data[2] - 1U & 0x1f);
    if (0x1f < numBits.m_data[2]) {
      minValue.m_data[2] = -0x80000000;
    }
    if (numBits.m_data[2] == 0) {
      minValue.m_data[2] = iVar6;
    }
    minValue.m_data[1] = -1 << ((char)numBits.m_data[1] - 1U & 0x1f);
    if (0x1f < numBits.m_data[1]) {
      minValue.m_data[1] = -0x80000000;
    }
    if (numBits.m_data[1] == 0) {
      minValue.m_data[1] = iVar6;
    }
    minValue.m_data[0] = -1 << ((char)numBits.m_data[0] - 1U & 0x1f);
    if (0x1f < numBits.m_data[0]) {
      minValue.m_data[0] = -0x80000000;
    }
    TVar1 = (this->super_TextureBorderClampTest).m_channelClass;
    if (numBits.m_data[0] == 0) {
      minValue.m_data[0] = iVar6;
    }
    bVar4 = TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER;
    iVar7 = 0;
    if (!bVar4) {
      minValue.m_data[3] = iVar6;
      minValue.m_data[1] = iVar7;
      minValue.m_data[0] = iVar7;
      minValue.m_data[2] = iVar7;
    }
    iVar6 = getNBitIntegerMaxValue(bVar4,numBits.m_data[0]);
    iVar7 = getNBitIntegerMaxValue(bVar4,numBits.m_data[1]);
    iVar8 = getNBitIntegerMaxValue(bVar4,numBits.m_data[2]);
    maxValue.m_data[3] = getNBitIntegerMaxValue(bVar4,numBits.m_data[3]);
    maxValue.m_data[1] = iVar7;
    maxValue.m_data[0] = iVar6;
    maxValue.m_data[2] = iVar8;
    tcu::operator-((tcu *)&valueRange,&maxValue,&minValue);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&iteration,1);
    this_01 = (tcu *)&value;
    tcu::operator+(this_01,&maxValue,(Vector<int,_4> *)&iteration);
    TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
    iteration.p0.m_data[0] = -1.2;
    iteration.p0.m_data[1] = -3.0;
    iteration.p1.m_data[0] = 1.2;
    iteration.p1.m_data[1] = 2.5;
    if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      this_01 = (tcu *)&local_148;
      tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)this_01);
    }
    iteration.borderColor.v._0_8_ = *(undefined8 *)this_01;
    iteration.borderColor.v._8_8_ = *(undefined8 *)(this_01 + 8);
    tcu::Vector<float,_4>::Vector(&local_118,0.5);
    tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_128);
    tcu::operator/((tcu *)&local_148,&local_118,&local_128);
    iteration.lookupScale.m_data[0] = local_148.m_data[0];
    iteration.lookupScale.m_data[1] = local_148.m_data[1];
    iteration.lookupScale.m_data[2] = local_148.m_data[2];
    iteration.lookupScale.m_data[3] = local_148.m_data[3];
    tcu::Vector<float,_4>::Vector
              (&local_148,
               *(float *)(&DAT_00820d00 + (ulong)(TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) * 4))
    ;
    iteration.lookupBias.m_data[0] = local_148.m_data[0];
    iteration.lookupBias.m_data[1] = local_148.m_data[1];
    iteration.lookupBias.m_data[2] = local_148.m_data[2];
    iteration.lookupBias.m_data[3] = local_148.m_data[3];
    std::__cxx11::string::assign((char *)&iteration.description);
    this_00 = &this->m_iterations;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,&iteration);
    std::__cxx11::string::~string((string *)&iteration.description);
    if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&iteration,1);
      tcu::operator-((tcu *)&value,&minValue,(Vector<int,_4> *)&iteration);
      TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
      iteration.p0.m_data[0] = -0.25;
      iteration.p0.m_data[1] = -0.75;
      iteration.p1.m_data[0] = 2.25;
      iteration.p1.m_data[1] = 1.25;
      iteration.borderColor.v._0_4_ = value.m_data[0];
      iteration.borderColor.v._4_4_ = value.m_data[1];
      iteration.borderColor.v._8_4_ = value.m_data[2];
      iteration.borderColor.v._12_4_ = value.m_data[3];
      tcu::Vector<float,_4>::Vector(&local_118,0.5);
      tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_128);
      tcu::operator/((tcu *)&local_148,&local_118,&local_128);
      iteration.lookupScale.m_data[0] = local_148.m_data[0];
      iteration.lookupScale.m_data[1] = local_148.m_data[1];
      iteration.lookupScale.m_data[2] = local_148.m_data[2];
      iteration.lookupScale.m_data[3] = local_148.m_data[3];
      tcu::Vector<float,_4>::Vector(&local_148,0.5);
      iteration.lookupBias.m_data[0] = local_148.m_data[0];
      iteration.lookupBias.m_data[1] = local_148.m_data[1];
      iteration.lookupBias.m_data[2] = local_148.m_data[2];
      iteration.lookupBias.m_data[3] = local_148.m_data[3];
      std::__cxx11::string::assign((char *)&iteration.description);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
      ::push_back(this_00,&iteration);
      std::__cxx11::string::~string((string *)&iteration.description);
      iVar5 = 0x7fffffff;
    }
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&value,iVar5);
    TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
    iteration.p0.m_data[0] = -1.6;
    iteration.p0.m_data[1] = -2.1;
    iteration.p1.m_data[0] = 1.2;
    iteration.p1.m_data[1] = 3.5;
    pVVar11 = (Vector<float,_4> *)&value;
    if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_148);
      pVVar11 = &local_148;
    }
    iteration.borderColor.v._0_8_ = *(undefined8 *)pVVar11->m_data;
    iteration.borderColor.v._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
    tcu::Vector<float,_4>::Vector(&local_118,0.5);
    tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_128);
    tcu::operator/((tcu *)&local_148,&local_118,&local_128);
    iteration.lookupScale.m_data[0] = local_148.m_data[0];
    iteration.lookupScale.m_data[1] = local_148.m_data[1];
    iteration.lookupScale.m_data[2] = local_148.m_data[2];
    iteration.lookupScale.m_data[3] = local_148.m_data[3];
    tcu::Vector<float,_4>::Vector(&local_148,0.25);
    iteration.lookupBias.m_data[0] = local_148.m_data[0];
    iteration.lookupBias.m_data[1] = local_148.m_data[1];
    iteration.lookupBias.m_data[2] = local_148.m_data[2];
    iteration.lookupBias.m_data[3] = local_148.m_data[3];
    std::__cxx11::string::assign((char *)&iteration.description);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,&iteration);
    std::__cxx11::string::~string((string *)&iteration.description);
    if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_004afb39;
    tcu::Vector<int,_4>::Vector(&value,-0x80000000);
    TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
    iteration.p0.m_data[0] = -2.6;
    iteration.p0.m_data[1] = -4.0;
    iteration.p1.m_data[0] = 1.1;
    iteration.p1.m_data[1] = 1.5;
    iteration.borderColor.v._0_4_ = value.m_data[0];
    iteration.borderColor.v._4_4_ = value.m_data[1];
    iteration.borderColor.v._8_4_ = value.m_data[2];
    iteration.borderColor.v._12_4_ = value.m_data[3];
    tcu::Vector<float,_4>::Vector(&local_118,0.5);
    tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_128);
    tcu::operator/((tcu *)&local_148,&local_118,&local_128);
    iteration.lookupScale.m_data[0] = local_148.m_data[0];
    iteration.lookupScale.m_data[1] = local_148.m_data[1];
    iteration.lookupScale.m_data[2] = local_148.m_data[2];
    iteration.lookupScale.m_data[3] = local_148.m_data[3];
    tcu::Vector<float,_4>::Vector(&local_148,0.25);
    iteration.lookupBias.m_data[0] = local_148.m_data[0];
    iteration.lookupBias.m_data[1] = local_148.m_data[1];
    iteration.lookupBias.m_data[2] = local_148.m_data[2];
    iteration.lookupBias.m_data[3] = local_148.m_data[3];
    std::__cxx11::string::assign((char *)&iteration.description);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,&iteration);
  }
  else {
    if (TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT < TVar1) goto LAB_004afb39;
    if (TVar1 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numBits,0.5);
      s = 0.25;
    }
    else {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&numBits,0.25);
      s = 0.5;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&minValue,s);
    TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
    iteration.p0.m_data[0] = -1.2;
    iteration.p0.m_data[1] = -3.0;
    iteration.p1.m_data[0] = 1.2;
    iteration.p1.m_data[1] = 2.5;
    maxValue.m_data[0] = 0x3f8ccccd;
    maxValue.m_data[1] = 0x3fa66666;
    maxValue.m_data[2] = 0x400ccccd;
    maxValue.m_data[3] = 0x3fa66666;
    GVar12 = mapToFormatColorUnits(&texFormat,(Vec4 *)&maxValue);
    iteration.borderColor.v._0_8_ = GVar12.v._0_8_;
    iteration.borderColor.v._8_8_ = GVar12.v._8_8_;
    std::__cxx11::string::assign((char *)&iteration.description);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,&iteration);
    std::__cxx11::string::~string((string *)&iteration.description);
    TextureBorderClampTest::IterationConfig::IterationConfig(&iteration);
    iteration.p0.m_data[0] = -0.25;
    iteration.p0.m_data[1] = -0.75;
    iteration.p1.m_data[0] = 2.25;
    iteration.p1.m_data[1] = 1.25;
    maxValue.m_data[0] = -0x41b33333;
    maxValue.m_data[1] = -0x4099999a;
    maxValue.m_data[2] = -0x3fe66666;
    maxValue.m_data[3] = -0x40e66666;
    GVar12 = mapToFormatColorUnits(&texFormat,(Vec4 *)&maxValue);
    iteration.borderColor.v._0_8_ = GVar12.v._0_8_;
    iteration.borderColor.v._8_8_ = GVar12.v._8_8_;
    iteration.lookupScale.m_data[1] = (float)minValue.m_data[1];
    iteration.lookupScale.m_data[0] = (float)minValue.m_data[0];
    iteration.lookupScale.m_data[3] = (float)minValue.m_data[3];
    iteration.lookupScale.m_data[2] = (float)minValue.m_data[2];
    iteration.lookupBias.m_data[1] = (float)numBits.m_data[1];
    iteration.lookupBias.m_data[0] = (float)numBits.m_data[0];
    iteration.lookupBias.m_data[3] = (float)numBits.m_data[3];
    iteration.lookupBias.m_data[2] = (float)numBits.m_data[2];
    std::__cxx11::string::assign((char *)&iteration.description);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,&iteration);
  }
  std::__cxx11::string::~string((string *)&iteration.description);
LAB_004afb39:
  pIVar3 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar2 = this->m_filter;
  iVar5 = (int)(((long)(this->m_iterations).
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) / 0x78);
  pfVar9 = &pIVar3->compareRef;
  for (lVar10 = 0; lVar10 < iVar5; lVar10 = lVar10 + 1) {
    pfVar9[-0xd] = (float)dVar2;
    pfVar9[-0xc] = (float)dVar2;
    *(undefined8 *)(pfVar9 + -3) = 0x812d0000812d;
    *(undefined8 *)(pfVar9 + -1) = 0;
    pfVar9 = pfVar9 + 0x1e;
  }
  return iVar5;
}

Assistant:

void TextureBorderClampRangeClampCase::init (void)
{
	TextureBorderClampTest::init();

	const tcu::TextureFormat	texFormat		= tcu::getEffectiveDepthStencilTextureFormat(getTexture()->getRefTexture().getFormat(), m_sampleMode);
	const bool					isDepth			= isDepthFormat(m_texFormat, m_sampleMode);
	const bool					isFloat			= m_channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool					isFixed			= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT || m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const bool					isPureInteger	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER || m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER;

	if (isDepth || isFloat)
	{
		// infinities are commonly used values on depth/float borders
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= rr::GenericVec4(tcu::Vec4(std::numeric_limits<float>::infinity()));
			iteration.lookupScale	= tcu::Vec4(0.5f); // scale & bias to [0.25, 0.5] range to make out-of-range values visible
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border value infinity";
			m_iterations.push_back(iteration);
		}
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-std::numeric_limits<float>::infinity()));
			iteration.lookupScale	= tcu::Vec4(0.5f);
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border value negative infinity";
			m_iterations.push_back(iteration);
		}
	}
	else if (isPureInteger)
	{
		const tcu::IVec4			numBits		= tcu::getTextureFormatBitDepth(texFormat);
		const bool					isSigned	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER;

		// can't overflow 32bit integers with 32bit integers
		for (int ndx = 0; ndx < 4; ++ndx)
			DE_ASSERT(numBits[ndx] == 0 || numBits[ndx] == 8 || numBits[ndx] == 16);

		const tcu::IVec4	minValue		= getNBitIntegerVec4MinValue(isSigned, numBits);
		const tcu::IVec4	maxValue		= getNBitIntegerVec4MaxValue(isSigned, numBits);
		const tcu::IVec4	valueRange		= maxValue - minValue;
		const tcu::IVec4	divSafeRange	((valueRange[0]==0) ? (1) : (valueRange[0]),
											 (valueRange[1]==0) ? (1) : (valueRange[1]),
											 (valueRange[2]==0) ? (1) : (valueRange[2]),
											 (valueRange[3]==0) ? (1) : (valueRange[3]));

		// format max
		{
			const tcu::IVec4 value = maxValue + tcu::IVec4(1);

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= (isSigned) ? (rr::GenericVec4(value)) : (rr::GenericVec4(value.cast<deUint32>()));
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= (isSigned) ? (tcu::Vec4(0.5f)) : (tcu::Vec4(0.25f));
			iteration.description	= "border values one larger than maximum";
			m_iterations.push_back(iteration);
		}
		// format min
		if (isSigned)
		{
			const tcu::IVec4 value = minValue - tcu::IVec4(1);

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= rr::GenericVec4(value);
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.5f);
			iteration.description	= "border values one less than minimum";
			m_iterations.push_back(iteration);
		}
		// (u)int32 max
		{
			const tcu::IVec4 value = (isSigned) ? (tcu::IVec4(std::numeric_limits<deInt32>::max())) : (tcu::IVec4(std::numeric_limits<deUint32>::max()));

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.6f, -2.1f);
			iteration.p1			= tcu::Vec2( 1.2f,  3.5f);
			iteration.borderColor	= (isSigned) ? (rr::GenericVec4(value)) : (rr::GenericVec4(value.cast<deUint32>()));
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border values 32-bit maximum";
			m_iterations.push_back(iteration);
		}
		// int32 min
		if (isSigned)
		{
			const tcu::IVec4 value = tcu::IVec4(std::numeric_limits<deInt32>::min());

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-2.6f, -4.0f);
			iteration.p1			= tcu::Vec2( 1.1f,  1.5f);
			iteration.borderColor	= rr::GenericVec4(value);
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border values 0";
			m_iterations.push_back(iteration);
		}
	}
	else if (isFixed)
	{
		const bool		isSigned	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;;
		const tcu::Vec4	lookupBias	= (isSigned) ? (tcu::Vec4(0.5f))    : (tcu::Vec4(0.25f)); // scale & bias to [0.25, 0.5] range to make out-of-range values visible
		const tcu::Vec4	lookupScale	= (isSigned) ? (tcu::Vec4(0.25f))   : (tcu::Vec4(0.5f));

		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= mapToFormatColorUnits(texFormat, tcu::Vec4(1.1f, 1.3f, 2.2f, 1.3f));
			iteration.lookupScale	= lookupScale;
			iteration.lookupBias	= lookupBias;
			iteration.description	= "border values larger than maximum";
			m_iterations.push_back(iteration);
		}
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= mapToFormatColorUnits(texFormat, tcu::Vec4(-0.2f, -0.9f, -2.4f, -0.6f));
			iteration.lookupScale	= lookupScale;
			iteration.lookupBias	= lookupBias;
			iteration.description	= "border values less than minimum";
			m_iterations.push_back(iteration);
		}
	}
	else
		DE_ASSERT(false);

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.compareMode	= GL_NONE;
		iteration.compareRef	= 0.0f;
	}
}